

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
           *this,Boxed_Value *param)

{
  Type_Conversions *pTVar1;
  _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> this_01;
  Boxed_Value BVar3;
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  Type_Conversions_State state;
  allocator_type local_61;
  Type_Conversions_State local_60;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_50;
  Boxed_Value local_38;
  
  pTVar1 = (Type_Conversions *)
           param[1].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (pTVar1 == (Type_Conversions *)0x0) {
    local_60.m_conversions._M_data = (Type_Conversions *)*in_RDX;
    local_60.m_saves._M_data = (Conversion_Saves *)in_RDX[1];
    if (local_60.m_saves._M_data != (mapped_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((local_60.m_saves._M_data)->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&((local_60.m_saves._M_data)->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&((local_60.m_saves._M_data)->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&((local_60.m_saves._M_data)->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_60;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_50,__l_00,(allocator_type *)&local_38);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,
               (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)param,&local_50,(Type_Conversions_State *)0x0);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_50);
    _Var2._M_pi = extraout_RDX_00;
    this_01._M_data = local_60.m_saves._M_data;
  }
  else {
    this_00 = (_Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)chaiscript::detail::threading::
                 Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::t();
    local_60.m_saves._M_data =
         std::__detail::
         _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[](this_00,&(pTVar1->m_conversion_saves).m_key);
    local_38.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)*in_RDX;
    local_38.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if ((mapped_type *)
        local_38.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (mapped_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((mapped_type *)
                  local_38.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(((mapped_type *)
                       local_38.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((mapped_type *)
                  local_38.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(((mapped_type *)
                       local_38.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    __l._M_len = 1;
    __l._M_array = &local_38;
    local_60.m_conversions._M_data = pTVar1;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_50,__l,&local_61);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,
               (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)param,&local_50,&local_60);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_50);
    _Var2._M_pi = extraout_RDX;
    this_01._M_data =
         (Conversion_Saves *)
         local_38.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  if (this_01._M_data != (mapped_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_data);
    _Var2._M_pi = extraout_RDX_01;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P&&  ...  param)
          {
            if (m_conversions) {
              Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, &state
                  );
            } else {
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, nullptr
                  );
            }

          }